

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

Point2f __thiscall pbrt::CylindricalMapping2D::cylinder(CylindricalMapping2D *this,Point3f *p)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  fVar9 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->textureFromRender).m.m[3][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[3][0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar9),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  fVar8 = auVar3._0_4_ + (this->textureFromRender).m.m[3][3];
  fVar6 = auVar2._0_4_ + (this->textureFromRender).m.m[1][3];
  fVar9 = auVar5._0_4_ + (this->textureFromRender).m.m[2][3];
  fVar7 = auVar4._0_4_ + (this->textureFromRender).m.m[0][3];
  bVar1 = fVar8 == 1.0;
  fVar6 = (float)((uint)bVar1 * (int)fVar6 + (uint)!bVar1 * (int)(fVar6 / fVar8));
  fVar7 = (float)((uint)bVar1 * (int)fVar7 + (uint)!bVar1 * (int)(fVar7 / fVar8));
  fVar8 = (float)((uint)bVar1 * (int)fVar9 + (uint)!bVar1 * (int)(fVar9 / fVar8));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)fVar7),ZEXT416((uint)fVar7))
  ;
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  fVar9 = auVar2._0_4_;
  fVar6 = atan2f(fVar6 / fVar9,fVar7 / fVar9);
  auVar2 = vinsertps_avx(ZEXT416((uint)((fVar6 + 3.1415927) * 0.15915494)),
                         ZEXT416((uint)(fVar8 / fVar9)),0x10);
  return (Point2f)auVar2._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f cylinder(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        return Point2f((Pi + std::atan2(vec.y, vec.x)) * Inv2Pi, vec.z);
    }